

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O2

TPZMatrix<double> * __thiscall
TPZParFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>::
CreateAssemble(TPZParFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
               *this,TPZFMatrix<double> *rhs,TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  int64_t globalsize;
  int iVar1;
  TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *this_00;
  undefined4 extraout_var;
  TPZAutoPointer<TPZGuiInterface> local_30;
  
  TPZStructMatrixTBBFlow<double>::InitCreateAssemble
            ((TPZStructMatrixTBBFlow<double> *)
             &(this->
              super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
              ).super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0);
  globalsize = (&(this->
                 super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
                 ).super_TPZStructMatrixT<double>.super_TPZStructMatrix.fEquationFilter.fNumEq)
               [(ulong)(this->
                       super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
                       ).super_TPZStructMatrixT<double>.super_TPZStructMatrix.fEquationFilter.
                       fIsActive * 4];
  this_00 = (TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *)
            operator_new(800);
  TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>::TPZParFrontMatrix
            (this_00,globalsize);
  if ((this->
      super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>).
      fDecomposeType != ENoDecompose) {
    iVar1 = (*(this_00->
              super_TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>).
              super_TPZAbstractFrontMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              super_TPZSavable._vptr_TPZSavable[0x4f])(this_00);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))
              ((long *)CONCAT44(extraout_var,iVar1),
               (this->
               super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
               ).fDecomposeType);
  }
  (*(rhs->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (rhs,globalsize,1);
  local_30 = (TPZAutoPointer<TPZGuiInterface>)guiInterface->fRef;
  LOCK();
  ((local_30.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_30.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  (**(code **)(*(long *)&(this->
                         super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
                         ).super_TPZStructMatrixT<double>.super_TPZStructMatrix + 0x78))
            (this,this_00,rhs);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_30);
  return (TPZMatrix<double> *)this_00;
}

Assistant:

TPZMatrix<TVar> * TPZParFrontStructMatrix<TFront,TVar,TPar>::CreateAssemble(TPZFMatrix<TVar> &rhs,TPZAutoPointer<TPZGuiInterface> guiInterface)
{
    TPar::InitCreateAssemble();
	
	//TPZFrontMatrix<TPZStackEqnStorage, TFront> *mat = new TPZFrontMatrix<TPZStackEqnStorage, TFront>(fMesh->NEquations());
	
	//TPZFrontMatrix<TPZFileEqnStorage, TFront> *mat = new TPZFrontMatrix<TPZFileEqnStorage, TFront>(fMesh->NEquations());
	int64_t neq = this->fEquationFilter.NActiveEquations();
	
	//
#ifdef STACKSTORAGE
	TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, TFront> *mat = new TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, TFront>(neq);
#else
    TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront> *mat = new TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront>(neq);
#endif
    if (this->fDecomposeType != ENoDecompose)
    {
        mat->GetFront().SetDecomposeType(this->fDecomposeType);
    }
	rhs.Redim(neq,1);
	
	Assemble(*mat,rhs,guiInterface);
	return mat;
	
}